

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O2

Status __thiscall
leveldb::log::Writer::EmitPhysicalRecord(Writer *this,RecordType t,char *ptr,size_t length)

{
  WritableFile *pWVar1;
  uint __line;
  uint32_t uVar2;
  undefined4 in_register_00000034;
  undefined8 *puVar3;
  char *__assertion;
  ulong in_R8;
  char buf [7];
  Status local_40;
  undefined8 local_38;
  Status local_30;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000034,t);
  if (in_R8 < 0x10000) {
    if ((long)*(int *)(puVar3 + 1) + in_R8 + 7 < 0x8001) {
      buf[4] = (char)in_R8;
      buf[5] = (char)(in_R8 >> 8);
      buf[6] = (char)ptr;
      uVar2 = crc32c::Extend(*(uint32_t *)((long)puVar3 + ((ulong)ptr & 0xffffffff) * 4 + 0xc),
                             (char *)length,in_R8);
      buf._0_4_ = (uVar2 << 0x11 | uVar2 >> 0xf) + 0xa282ead8;
      local_38 = 7;
      local_40.state_ = buf;
      (**(code **)(*(long *)*puVar3 + 0x10))(this);
      if (this->dest_ == (WritableFile *)0x0) {
        local_40.state_ = (char *)length;
        (**(code **)(*(long *)*puVar3 + 0x10))(&local_30);
        pWVar1 = this->dest_;
        this->dest_ = (WritableFile *)local_30.state_;
        local_30.state_ = (char *)pWVar1;
        Status::~Status(&local_30);
        if (this->dest_ == (WritableFile *)0x0) {
          (**(code **)(*(long *)*puVar3 + 0x20))(&local_40);
          pWVar1 = this->dest_;
          this->dest_ = (WritableFile *)local_40.state_;
          local_40.state_ = (char *)pWVar1;
          Status::~Status(&local_40);
        }
      }
      *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + (int)in_R8 + 7;
      return (Status)(char *)this;
    }
    __assertion = "block_offset_ + kHeaderSize + length <= kBlockSize";
    __line = 0x55;
  }
  else {
    __assertion = "length <= 0xffff";
    __line = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_writer.cc"
                ,__line,
                "Status leveldb::log::Writer::EmitPhysicalRecord(RecordType, const char *, size_t)")
  ;
}

Assistant:

Status Writer::EmitPhysicalRecord(RecordType t, const char* ptr,
                                  size_t length) {
  assert(length <= 0xffff);  // Must fit in two bytes
  assert(block_offset_ + kHeaderSize + length <= kBlockSize);

  // Format the header
  char buf[kHeaderSize];
  buf[4] = static_cast<char>(length & 0xff);
  buf[5] = static_cast<char>(length >> 8);
  buf[6] = static_cast<char>(t);

  // Compute the crc of the record type and the payload.
  uint32_t crc = crc32c::Extend(type_crc_[t], ptr, length);
  crc = crc32c::Mask(crc);  // Adjust for storage
  EncodeFixed32(buf, crc);

  // Write the header and the payload
  Status s = dest_->Append(Slice(buf, kHeaderSize));
  if (s.ok()) {
    s = dest_->Append(Slice(ptr, length));
    if (s.ok()) {
      s = dest_->Flush();
    }
  }
  block_offset_ += kHeaderSize + length;
  return s;
}